

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O1

size_t rtosc_scan_arg_val(char *src,rtosc_arg_val_t *arg,size_t nargs,char *buffer_for_strings,
                         size_t *bufsize,size_t args_before,int follow_ellipsis)

{
  size_t sVar1;
  byte bVar2;
  byte bVar5;
  char cVar6;
  uint8_t uVar7;
  int iVar8;
  int32_t iVar9;
  ulong uVar10;
  char *pcVar11;
  __int32_t **pp_Var12;
  ushort **ppuVar13;
  size_t sVar14;
  rtosc_arg_val_t *prVar15;
  rtosc_arg_val_t *prVar16;
  size_t sVar17;
  uint uVar18;
  long lVar19;
  uint8_t *puVar20;
  size_t sVar21;
  uint8_t *puVar22;
  bool bVar23;
  ushort uVar24;
  int rd;
  uint64_t secfracs;
  float secfracsf;
  char bytes16 [16];
  size_t zero;
  rtosc_arg_val_t tmp_2;
  uint8_t *local_110;
  char local_105;
  int local_104;
  uint8_t *local_100;
  char *local_f8;
  rtosc_arg_val_t *local_f0;
  rtosc_arg_val_t local_e8;
  size_t local_d0;
  rtosc_arg_val_t local_c8;
  undefined1 local_a8 [12];
  undefined2 auStack_9c [2];
  undefined8 local_98;
  size_t local_68;
  ushort **local_60;
  size_t local_58;
  size_t local_50;
  rtosc_arg_val_t local_48;
  byte bVar3;
  byte bVar4;
  
  local_104 = 0;
  sVar17 = nargs - 1;
  bVar5 = *src;
  lVar19 = (long)(char)bVar5;
  local_110 = (uint8_t *)src;
  local_100 = (uint8_t *)buffer_for_strings;
  local_68 = args_before;
  if (bVar5 < 0x42) {
    if (bVar5 == 0x22) {
      local_110 = (uint8_t *)(src + 1);
      local_f8 = src;
      while( true ) {
        while (puVar20 = local_110, *local_110 != '\"') {
          *bufsize = *bufsize - 1;
          uVar7 = *local_110;
          local_110 = local_110 + 1;
          if (uVar7 == '\\') {
            uVar7 = get_escaped_char(*local_110,0);
            *buffer_for_strings = uVar7;
            local_110 = local_110 + 1;
          }
          else {
            *buffer_for_strings = uVar7;
          }
          buffer_for_strings = (char *)((uint8_t *)buffer_for_strings + 1);
        }
        if (local_110[1] != '\\') break;
        local_a8._0_8_ = local_a8._0_8_ & 0xffffffff00000000;
        __isoc99_sscanf(local_110,"\"\\ \"%n",local_a8);
        local_110 = puVar20 + (int)local_a8._0_4_;
      }
      *buffer_for_strings = '\0';
      *bufsize = *bufsize - 1;
      (arg->val).s = (char *)local_100;
      cVar6 = 's';
      puVar20 = local_110 + 1;
      if (local_110[1] == 'S') {
        *bufsize = *bufsize - 1;
        cVar6 = 'S';
        puVar20 = local_110 + 2;
      }
      local_110 = puVar20;
      arg->type = cVar6;
      src = local_f8;
    }
    else if (bVar5 == 0x23) {
      arg->type = 'r';
      local_110 = (uint8_t *)(src + 1);
      __isoc99_sscanf(local_110,"%x",&arg->val);
      local_110 = (uint8_t *)(src + 9);
    }
    else {
      if (bVar5 != 0x27) goto LAB_0010efd9;
      arg->type = 'c';
      local_110 = (uint8_t *)(src + 1);
      uVar18 = (uint)src[1];
      if (uVar18 == 0x5c) {
        cVar6 = src[3];
        uVar18 = 0x5c;
        if (((long)cVar6 != 0) &&
           (ppuVar13 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar13 + (long)cVar6 * 2 + 1) & 0x20) == 0)) {
          local_110 = (uint8_t *)(src + 2);
          bVar5 = get_escaped_char(src[2],1);
          uVar18 = (uint)bVar5;
        }
      }
      (arg->val).i = uVar18;
      local_110 = local_110 + 2;
    }
  }
  else {
    uVar10 = (ulong)(bVar5 - 0x4d);
    puVar20 = (uint8_t *)src;
    if (bVar5 - 0x4d < 0x28) {
      if ((0x8212000000U >> (uVar10 & 0x3f) & 1) == 0) {
        if (uVar10 == 0) {
          iVar8 = strncmp("MIDI",src,4);
          if (iVar8 == 0) {
            ppuVar13 = __ctype_b_loc();
            if (((long)src[4] == 0x5b) || (((*ppuVar13)[src[4]] & 0x2000) != 0)) {
              arg->type = 'm';
              __isoc99_sscanf(src,"MIDI [ 0x%x 0x%x 0x%x 0x%x ]%n",local_a8,local_a8 + 4,
                              local_a8 + 8,auStack_9c,&local_104);
              local_110 = (uint8_t *)(src + local_104);
              uVar24 = auStack_9c[0] & 0xff;
              bVar5 = ((local_a8._0_8_ & 0xff) != 0) * ((local_a8._0_2_ & 0xff) < 0x100) *
                      (char)local_a8._0_8_ - (0xff < (local_a8._0_2_ & 0xff));
              bVar2 = ((local_a8._0_8_ & 0xff00000000) != 0) * ((local_a8._4_2_ & 0xff) < 0x100) *
                      SUB81(local_a8._0_8_,4) - (0xff < (local_a8._4_2_ & 0xff));
              bVar3 = ((local_a8._8_4_ & 0xff) != 0) * ((local_a8._8_2_ & 0xff) < 0x100) *
                      (uint8_t)local_a8._8_4_ - (0xff < (local_a8._8_2_ & 0xff));
              bVar4 = (uVar24 != 0) * (uVar24 < 0x100) * (char)auStack_9c[0] - (0xff < uVar24);
              (arg->val).i = CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                                      CONCAT12((bVar3 != 0) * (bVar3 < 0x100) * bVar3 -
                                               (0xff < bVar3),
                                               CONCAT11((bVar2 != 0) * (bVar2 < 0x100) * bVar2 -
                                                        (0xff < bVar2),
                                                        (bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                                        (0xff < bVar5))));
              goto LAB_0010f348;
            }
          }
          goto LAB_0010f0c6;
        }
        if (uVar10 != 0xe) goto LAB_0010ee28;
        local_f8 = src;
        local_f0 = arg;
        local_60 = __ctype_b_loc();
        puVar20 = local_110;
        do {
          puVar22 = puVar20 + 1;
          puVar20 = puVar20 + 1;
        } while ((*(byte *)((long)*local_60 + (long)(char)*puVar22 * 2 + 1) & 0x20) != 0);
        prVar15 = local_f0 + 1;
        local_105 = ' ';
        sVar21 = 0;
        sVar14 = 0;
        local_110 = puVar20;
        while ((arg = local_f0, *puVar20 != ']' && (*puVar20 != '\0'))) {
          sVar1 = *bufsize;
          local_d0 = sVar21;
          local_58 = sVar14;
          sVar14 = rtosc_scan_arg_val((char *)puVar20,prVar15,sVar17,(char *)local_100,bufsize,
                                      sVar14,1);
          cVar6 = prVar15->type;
          if (cVar6 == '-') {
            iVar9 = rtosc_av_rep_has_delta(prVar15);
            prVar16 = prVar15 + 2;
            if (iVar9 == 0) {
              prVar16 = prVar15 + 1;
            }
            cVar6 = prVar16->type;
          }
          local_105 = cVar6;
          iVar8 = next_arg_offset(prVar15);
          prVar15 = prVar15 + iVar8;
          puVar20 = puVar20 + (sVar14 - 1);
          do {
            puVar22 = puVar20 + 1;
            puVar20 = puVar20 + 1;
          } while ((*(byte *)((long)*local_60 + (long)(char)*puVar22 * 2 + 1) & 0x20) != 0);
          sVar17 = sVar17 - (long)iVar8;
          local_100 = local_100 + (sVar1 - *bufsize);
          sVar14 = local_58 + 1;
          sVar21 = (size_t)(uint)(iVar8 + (int)local_d0);
        }
        local_110 = puVar20 + 1;
        local_f0->type = 'a';
        rtosc_av_arr_type_set(local_f0,local_105);
        rtosc_av_arr_len_set(arg,(int32_t)sVar21);
        src = local_f8;
      }
      else {
        pcVar11 = skip_word("immediately",(char **)&local_110);
        if ((pcVar11 == (char *)0x0) &&
           (pcVar11 = skip_word("now",(char **)&local_110), pcVar11 == (char *)0x0)) {
          pcVar11 = skip_word("true",(char **)&local_110);
          if ((pcVar11 == (char *)0x0) &&
             (pcVar11 = skip_word("false",(char **)&local_110), pcVar11 == (char *)0x0)) {
            pcVar11 = skip_word("nil",(char **)&local_110);
            if ((pcVar11 == (char *)0x0) &&
               (pcVar11 = skip_word("inf",(char **)&local_110), puVar20 = local_110,
               pcVar11 == (char *)0x0)) goto LAB_0010f0c6;
            pp_Var12 = __ctype_toupper_loc();
            arg->type = (char)(*pp_Var12)[lVar19];
          }
          else {
            pp_Var12 = __ctype_toupper_loc();
            arg->type = (char)(*pp_Var12)[lVar19];
            (arg->val).T = local_110[-2] == 'u';
          }
        }
        else {
          rtosc_arg_val_immediatelly(arg);
        }
      }
    }
    else {
LAB_0010ee28:
      if (bVar5 == 0x42) {
        arg->type = 'b';
        __isoc99_sscanf(src,"BLOB [ %i %n",&arg->val,&local_104);
        if ((long)local_104 == 0) {
LAB_0010f0c6:
          local_110 = (uint8_t *)parse_identifier((char *)puVar20,arg,(char *)local_100,bufsize);
        }
        else {
          puVar20 = (uint8_t *)(src + local_104);
          *bufsize = *bufsize - (long)(arg->val).i;
          (arg->val).b.data = local_100;
          local_f8 = src;
          if (0 < (arg->val).i) {
            lVar19 = 0;
            local_110 = puVar20;
            do {
              __isoc99_sscanf(puVar20,"0x%x %n",local_a8,&local_e8);
              (arg->val).b.data[lVar19] = local_a8[0];
              puVar20 = puVar20 + (int)local_e8._0_4_;
              lVar19 = lVar19 + 1;
            } while (lVar19 < (arg->val).i);
          }
          local_110 = puVar20 + 1;
          src = local_f8;
        }
      }
      else {
LAB_0010efd9:
        local_d0 = sVar17;
        iVar8 = is_range_multiplier(src);
        if (iVar8 == 0) {
          if ((bVar5 == 0x5f) ||
             (ppuVar13 = __ctype_b_loc(), (*(byte *)((long)*ppuVar13 + lVar19 * 2 + 1) & 4) != 0)) {
            arg->type = 'S';
            (arg->val).s = (char *)local_100;
            puVar20 = local_110;
            puVar22 = local_100;
            while ((uVar7 = *puVar20, (long)(char)uVar7 == 0x5f ||
                   (ppuVar13 = __ctype_b_loc(), ((*ppuVar13)[(char)uVar7] & 8) != 0))) {
              *bufsize = *bufsize - 1;
              *puVar22 = *puVar20;
              puVar22 = puVar22 + 1;
              puVar20 = puVar20 + 1;
            }
            *bufsize = *bufsize - 1;
            *puVar22 = '\0';
            local_110 = puVar20;
          }
          else if ((((bVar5 == 0) || (src[1] == '\0')) || (src[2] == '\0')) ||
                  ((src[3] == '\0' || (src[4] != '-')))) {
            bVar23 = false;
            arg->type = '\0';
            local_c8._0_8_ = local_c8._0_8_ & 0xffffffffffffff00;
            puVar20 = local_110;
            local_f8 = src;
            do {
              local_104 = 0;
              pcVar11 = scanf_fmtstr((char *)puVar20,&local_c8.type);
              fast_strcpy(local_a8,pcVar11,0x10);
              local_a8[1] = 0x25;
              if (arg->type == '\0') {
                arg->type = local_c8.type;
              }
              if (((byte)local_c8.type - 100 < 6) &&
                 ((0x35U >> ((byte)local_c8.type - 100 & 0x1f) & 1) != 0)) {
                __isoc99_sscanf(puVar20,local_a8 + 1,&arg->val,&local_104);
              }
              puVar20 = puVar20 + local_104;
              local_110 = puVar20;
              if (bVar23) {
                local_e8._0_8_ = local_e8._0_8_ & 0xffffffff00000000;
                bVar23 = false;
                __isoc99_sscanf(puVar20," )%n",&local_e8);
                puVar20 = puVar20 + (int)local_e8._0_4_;
                local_110 = puVar20;
              }
              else {
                uVar7 = *puVar20;
                puVar22 = puVar20;
                while ((uVar7 != '\0' && (iVar8 = isspace((int)(char)uVar7), iVar8 != 0))) {
                  uVar7 = puVar22[1];
                  puVar22 = puVar22 + 1;
                }
                if (*puVar22 == '(') {
                  do {
                    puVar20 = puVar22 + 1;
                    if (puVar22[1] == '\0') break;
                    iVar8 = isspace((int)(char)puVar22[1]);
                    puVar22 = puVar20;
                  } while (iVar8 != 0);
                  bVar23 = true;
                  local_110 = puVar20;
                }
              }
              src = local_f8;
            } while (bVar23);
          }
          else {
            (arg->val).d = 0.0;
            local_a8._8_4_ = 0;
            local_a8._0_8_ = 0;
            local_f8 = src;
            local_f0 = arg;
            __isoc99_sscanf(src,"%4d-%2d-%2d%n",(long)&local_98 + 4,&local_98,auStack_9c);
            puVar20 = (uint8_t *)(src + local_104);
            local_104 = 0;
            local_110 = puVar20;
            __isoc99_sscanf(puVar20," %2d:%2d%n",local_a8 + 8,local_a8 + 4,&local_104);
            if ((long)local_104 != 0) {
              local_110 = puVar20 + local_104;
            }
            puVar20 = local_110;
            local_104 = 0;
            __isoc99_sscanf(local_110,":%2d%n",local_a8,&local_104);
            if ((long)local_104 != 0) {
              local_110 = puVar20 + local_104;
            }
            puVar20 = local_110;
            local_e8._0_8_ = (ulong)(uint)local_e8._4_4_ << 0x20;
            __isoc99_sscanf(local_110,"%*f (%n",&local_e8);
            arg = local_f0;
            src = local_f8;
            puVar20 = puVar20 + (int)local_e8._0_4_;
            local_110 = puVar20;
            if ((long)(int)local_e8._0_4_ == 0) {
              if (*puVar20 == '.') {
                __isoc99_sscanf(puVar20,"%f%n",&local_c8,&local_104);
                arg = local_f0;
                local_110 = puVar20 + local_104;
                local_e8._0_8_ = rtosc_float2secfracs((float)local_c8._0_4_);
              }
              else {
                local_e8._0_8_ = 0;
              }
            }
            else {
              __isoc99_sscanf(puVar20," ... + 0x%8lxp-32 s )%n",&local_e8,&local_104);
              local_110 = puVar20 + local_104;
            }
            local_98 = CONCAT44((int)((ulong)local_98 >> 0x20) + -0x76c,(int)local_98 + -1);
            rtosc_arg_val_from_params(arg,(tm_conflict *)local_a8,local_e8._0_8_);
          }
        }
        else {
          local_e8._0_8_ = local_e8._0_8_ & 0xffffffff00000000;
          __isoc99_sscanf(src,"%dx%n",local_a8,&local_e8);
          puVar20 = (uint8_t *)(src + (int)local_e8._0_4_);
          arg->type = '-';
          local_110 = puVar20;
          rtosc_av_rep_num_set(arg,local_a8._0_4_);
          rtosc_av_rep_has_delta_set(arg,0);
          sVar17 = rtosc_scan_arg_val((char *)puVar20,arg + 1,local_d0,(char *)local_100,bufsize,0,0
                                     );
          iVar8 = next_arg_offset(arg + 1);
          arg = arg + (long)iVar8 + 1;
          local_110 = puVar20 + sVar17;
        }
      }
    }
  }
LAB_0010f348:
  puVar20 = local_110;
  ppuVar13 = __ctype_b_loc();
  puVar20 = puVar20 + 1;
  do {
    puVar22 = puVar20;
    puVar20 = puVar22 + 1;
  } while ((*(byte *)((long)*ppuVar13 + (long)(char)puVar22[-1] * 2 + 1) & 0x20) != 0);
  if ((follow_ellipsis == 0) ||
     (iVar8 = strncmp((char *)(puVar22 + -1),"...",3), sVar17 = local_68, iVar8 != 0))
  goto LAB_0010f50a;
  local_c8.val.b.data = (arg->val).b.data;
  local_c8.type = arg->type;
  local_c8._1_7_ = *(undefined7 *)&arg->field_0x1;
  local_c8.val.d = (arg->val).d;
  do {
    uVar7 = puVar20[1];
    puVar20 = puVar20 + 1;
  } while ((*(byte *)((long)*ppuVar13 + (long)(char)uVar7 * 2 + 1) & 0x20) != 0);
  local_110 = puVar20;
  if (uVar7 != ']') {
    sVar14 = rtosc_scan_arg_val((char *)puVar20,&local_e8,1,(char *)0x0,&local_50,0,0);
    local_110 = puVar20 + sVar14;
  }
  if ((sVar17 < 3) || (arg[-3].type != '-')) {
LAB_0010f450:
    prVar15 = arg + -1;
  }
  else {
    prVar15 = arg + -3;
    iVar9 = rtosc_av_rep_has_delta(prVar15);
    if (iVar9 == 0) goto LAB_0010f450;
    iVar9 = rtosc_av_rep_num(prVar15);
    prVar15 = rtosc_arg_val_range_arg(prVar15,iVar9 + -1,&local_48);
  }
  bVar23 = true;
  if ((local_c8.type != '-' && sVar17 != 0) &&
     (((cVar6 = prVar15->type, cVar6 == local_c8.type || ((local_c8.type == 'F' && (cVar6 == 'T'))))
      || ((local_c8.type == 'T' && (cVar6 == 'F')))))) {
    iVar8 = rtosc_arg_vals_cmp_single(prVar15,&local_c8,(rtosc_cmp_options *)0x0);
    bVar23 = iVar8 == 0;
  }
  if (uVar7 == ']') {
    uVar18 = 0;
    iVar9 = 0;
    if (bVar23 == false) goto LAB_0010f4b4;
  }
  else {
LAB_0010f4b4:
    prVar16 = &local_e8;
    if (uVar7 == ']') {
      prVar16 = (rtosc_arg_val_t *)0x0;
    }
    iVar9 = delta_from_arg_vals(prVar15,&local_c8,prVar16,(rtosc_arg_val_t *)local_a8,(uint)bVar23);
    uVar18 = (uint)(iVar9 != -1 || uVar7 != ']');
  }
  insert_arg_range(arg,iVar9,&local_c8,uVar18,(rtosc_arg_val_t *)local_a8,1,1);
LAB_0010f50a:
  return (long)local_110 - (long)src;
}

Assistant:

size_t rtosc_scan_arg_val(const char* src,
                          rtosc_arg_val_t *arg, size_t nargs,
                          char* buffer_for_strings, size_t* bufsize,
                          size_t args_before, int follow_ellipsis)
{
    int rd = 0;
    const char* start = src;
    assert(nargs);
    --nargs;
    switch(*src)
    {
        case 't':
        case 'f':
        case 'n':
        case 'i':
        {
            const char* src_backup = src;
            // timestamps "immediately" or "now"?
            if(skip_word("immediately", &src) || skip_word("now", &src))
            {
                rtosc_arg_val_immediatelly(arg);
            }
            else if(skip_word("true", &src)  ||
                    skip_word("false", &src) )
            {
                arg->type = toupper(*src_backup);
                arg->val.T = (src[-2] == 'u');
            }
            else if(skip_word("nil", &src)   ||
                    skip_word("inf", &src))
            {
                arg->type = toupper(*src_backup);
            }
            else
            {
                // no reserved keyword => identifier
                src = parse_identifier(src, arg, buffer_for_strings, bufsize);
            }
            break;
        }
        case '#':
        {
            arg->type = 'r';
            sscanf(++src, "%x", &arg->val.i);
            src+=8;
            break;
        }
        case '\'':
            // type 1: '<noslash>' => normal char
            // type 2: '\<noquote>' => escaped char
            // type 3: '\'' => escaped quote
            // type 4: '\'<isspace> => mistyped backslash
            arg->type = 'c';
            if(*++src == '\\')
            {
                if(src[2] && !isspace(src[2])) // escaped and 4 chars
                    arg->val.i = get_escaped_char(*++src, true);
                else // escaped, but only 3 chars: type 4
                    arg->val.i = '\\';
            }
            else // non-escaped
                arg->val.i = *src;
            src+=2;
            break;
        case '"':
        {
            ++src; // skip obligatory '"'
            char* dest = buffer_for_strings;
            bool cont;
            do
            {
                while(*src != '"')
                {
                    (*bufsize)--;
                    assert(*bufsize);
                    if(*src == '\\') {
                        *dest++ = get_escaped_char(*++src, false);
                        ++src;
                    }
                    else
                        *dest++ = *src++;
                }
                if(src[1] == '\\')
                {
                    skip_fmt(&src, "\"\\ \"%n");
                    cont = true;
                }
                else
                    cont = false;
            } while (cont);
            *dest = 0;
            ++src; // skip final '"'
            (*bufsize)--;
            arg->val.s = buffer_for_strings;
            if(*src == 'S')
            {
                ++src;
                (*bufsize)--;
                arg->type = 'S';
            }
            else
                arg->type = 's';
            break;
        }
        case 'M':
        {
            if(!strncmp("MIDI", src, 4) && (isspace(src[4]) || src[4] == '['))
            {
                arg->type = 'm';
                int32_t tmp[4];
                sscanf(src, "MIDI [ 0x%"PRIx32" 0x%"PRIx32
                                  " 0x%"PRIx32" 0x%"PRIx32" ]%n",
                       tmp, tmp + 1, tmp + 2, tmp + 3, &rd); src+=rd;
                for(size_t i = 0; i < 4; ++i)
                    arg->val.m[i] = tmp[i]; // copy to 8 bit array
            }
            else
                src = parse_identifier(src, arg, buffer_for_strings, bufsize);
            break;
        }
        case '[':
        {
            while(isspace(*++src));
            int32_t num_read = 0;

            rtosc_arg_val_t* start_arg = arg++;

            size_t last_bufsize;

            char arrtype = ' ';
            for(size_t i = 0; src && *src && *src != ']'; ++i)
            {
                last_bufsize = *bufsize;

                src += rtosc_scan_arg_val(src, arg, nargs,
                                          buffer_for_strings, bufsize, i, 1);
                arrtype = arg->type;
                if(arrtype == '-')
                    arrtype = rtosc_av_rep_has_delta(arg) ? arg[2].type : arg[1].type;

                size_t args_scanned = next_arg_offset(arg);
                nargs -= args_scanned;
                arg += args_scanned;
                num_read += args_scanned;

                for( ; isspace(*src); ++src) ;

                buffer_for_strings += (last_bufsize - *bufsize);
                // TODO: allow comments in arrays, blobs, midi?
            }

            ++src; // ']'
            start_arg->type = 'a';
            rtosc_av_arr_type_set(start_arg, arrtype);
            rtosc_av_arr_len_set(start_arg, num_read);

            arg = start_arg; // invariant: arg is back at the start
            break;
        }
        case 'B': // blob
        {
            arg->type = 'b';
            sscanf(src, "BLOB [ %"PRIi32" %n", &arg->val.b.len, &rd);
            if(rd)
            {
                src +=rd;

                assert(*bufsize >= (size_t)arg->val.b.len);
                *bufsize -= (size_t)arg->val.b.len;
                arg->val.b.data = (uint8_t*)buffer_for_strings;
                for(int32_t i = 0; i < arg->val.b.len; ++i)
                {
                    int32_t tmp;
                    int rd;
                    sscanf(src, "0x%x %n", &tmp, &rd);
                    arg->val.b.data[i] = tmp;
                    src+=rd;
                }

                ++src; // skip ']'
            }
            else
                src = parse_identifier(src, arg, buffer_for_strings, bufsize);
            break;
        }
        default:
            // nx... ? (n > 0)
            if(is_range_multiplier(src))
            {
                // collect information for range_arg
                int multiplier, rd = 0;
                sscanf(src, "%dx%n", &multiplier, &rd);
                src += rd;
                arg->type = '-';
                rtosc_av_rep_num_set(arg, multiplier);
                rtosc_av_rep_has_delta_set(arg, 0);

                ++arg;
                // read value-arg
                size_t old_bufsize = *bufsize;
                size_t tmp = rtosc_scan_arg_val(src, arg, nargs,
                                                buffer_for_strings, bufsize,
                                                0, 0);
                buffer_for_strings += old_bufsize - *bufsize;
                int args_scanned = next_arg_offset(arg);
                nargs -= args_scanned;
                arg += args_scanned;
                src += tmp;
            }
            // is it an identifier?
            else if(*src == '_' || isalpha(*src))
            {
                arg->type = 'S';
                arg->val.s = buffer_for_strings;
                for(; *src == '_' || isalnum(*src); ++src)
                {
                    assert(*bufsize);
                    (*bufsize)--;
                    *buffer_for_strings = *src;
                    ++buffer_for_strings;
                }
                assert(*bufsize);
                (*bufsize)--;
                *buffer_for_strings = 0;
                ++buffer_for_strings;
            }
            // "YYYY-" => it's a date
            else if(src[0] && src[1] && src[2] && src[3] && src[4] == '-')
            {
                arg->val.t = 0;

                struct tm m_tm;
                m_tm.tm_hour = 0;
                m_tm.tm_min = 0;
                m_tm.tm_sec = 0;
                sscanf(src, "%4d-%2d-%2d%n",
                       &m_tm.tm_year, &m_tm.tm_mon, &m_tm.tm_mday, &rd);
                src+=rd;
                float secfracsf;

                rd = 0;
                sscanf(src, " %2d:%2d%n", &m_tm.tm_hour, &m_tm.tm_min, &rd);
                if(rd)
                 src+=rd;

                rd = 0;
                sscanf(src, ":%2d%n", &m_tm.tm_sec, &rd);
                if(rd)
                 src+=rd;

                uint64_t secfracs;

                // lossless format is appended in parentheses?
                //  => take it directly from there
                if(skip_fmt(&src, "%*f (%n"))
                {
                    sscanf(src, " ... + 0x%8"PRIx64"p-32 s )%n",
                           &secfracs, &rd);
                    src += rd;
                }
                // float number, but not lossless?
                //  => convert it to fractions of seconds
                else if(*src == '.')
                {
                    sscanf(src, "%f%n", &secfracsf, &rd);
                    src += rd;

                    secfracs = rtosc_float2secfracs(secfracsf);
                }
                else
                {
                    // no fractional / floating seconds part
                    secfracs = 0;
                }

                // posix adjustments
                m_tm.tm_year -= 1900;
                --m_tm.tm_mon;
                rtosc_arg_val_from_params(arg, &m_tm, secfracs);
            }
            else
            {
                char bytes16[16];
                char type = arg->type = 0;

                bool repeat_once = false;
                do
                {
                    rd = 0;

                    const char *fmtstr = scanf_fmtstr_scan(src, bytes16,
                                                           &type);
                    if(!arg->type) // the first occurrence determines the type
                     arg->type = type;

                    switch(type)
                    {
                        case 'h':
                            sscanf(src, fmtstr, &arg->val.h, &rd); break;
                        case 'i':
                            sscanf(src, fmtstr, &arg->val.i, &rd); break;
                        case 'f':
                            sscanf(src, fmtstr, &arg->val.f, &rd); break;
                        case 'd':
                            sscanf(src, fmtstr, &arg->val.d, &rd); break;
                    }
                    src += rd;

                    if(repeat_once)
                    {
                        // we have read the lossless part. skip spaces and ')'
                        skip_fmt(&src, " )%n");
                        repeat_once = false;
                    }
                    else
                    {
                        // is a lossless part appended in parentheses?
                        const char* after_num = src;
                        skip_while(&after_num, isspace);
                        if(*after_num == '(') {
                            ++after_num;
                            skip_while(&after_num, isspace);
                            src = after_num;
                            repeat_once = true;
                        }
                    }
                } while(repeat_once);
            } // date vs integer
        // case ident
    } // switch

    // is the argument being followed by an ellipsis?
    const char* src2 = src;
    for(; isspace(*src2); ++src2) ;

    if(follow_ellipsis && !strncmp(src2, "...", 3))
    {
        src = src2;
        rtosc_arg_val_t delta, rhs;
        size_t zero;

        // lhsarg has already been read
        rtosc_arg_val_t lhsarg = *arg;

        // skip ellipsis and read rhs
        src += 2;
        while(isspace(*++src)) ;

        int infinite_range = (*src == ']');

        if(!infinite_range)
            src += rtosc_scan_arg_val(src, &rhs, 1, NULL, &zero, 0, 0);

        /*
            these shall be conforming to delta_from_arg_vals,
            i.e. if ranges,    the last elements of the ranges
                 if no ranges, the elements themselves
         */
        // find llhs position
        rtosc_arg_val_t tmp;
        // argument "-2" could be a delta arg
        rtosc_arg_val_t* llhsarg = (args_before > 2 &&
                                    arg[-3].type == '-' &&
                                    rtosc_av_rep_has_delta(arg-3))
                      // -2 is a delta arg (following a range arg)?
                      ? rtosc_arg_val_range_arg(arg-3, rtosc_av_rep_num(arg-3)-1,
                                                &tmp)
                      : (args_before > 1 && arg[-2].type == '-')
                      // -2 is a range arg (without delta)?
                      ? arg-1
                      : arg-1; // normal case

        bool llhsarg_is_useless =
            (args_before < 1 ||
            lhsarg.type == '-' || !types_match(llhsarg->type, lhsarg.type)
            /* this includes llhsarg == '-' */
            || !rtosc_arg_vals_cmp_single(llhsarg, &lhsarg, NULL));


        bool has_delta = true;
        int32_t num;
        if(infinite_range && llhsarg_is_useless)
        {
            has_delta = false;
            num = 0; // suppress compiler warnings
        }
        else
        {
            num = delta_from_arg_vals(llhsarg, &lhsarg,
                                      infinite_range ? NULL : &rhs,
                                      &delta, llhsarg_is_useless);

            assert(infinite_range || num > 0);
            if(infinite_range && num == -1)
            {
                has_delta = false;
            }
        }

        insert_arg_range(arg, num, &lhsarg, has_delta, &delta, true, true);
    }

    return (size_t)(src-start);
}